

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_metrics.c
# Opt level: O0

void ares_metrics_record(ares_query_t *query,ares_server_t *server,ares_status_t status,
                        ares_dns_record_t *dnsrec)

{
  ares_dns_rcode_t aVar1;
  time_t tVar2;
  time_t ts;
  ares_server_bucket_t i;
  ares_dns_rcode_t rcode;
  uint query_ms;
  ares_timeval_t tvdiff;
  ares_timeval_t now;
  ares_dns_record_t *dnsrec_local;
  ares_status_t status_local;
  ares_server_t *server_local;
  ares_query_t *query_local;
  
  if ((status == ARES_SUCCESS) && (server != (ares_server_t *)0x0)) {
    ares_tvnow((ares_timeval_t *)&tvdiff.usec);
    aVar1 = ares_dns_record_get_rcode(dnsrec);
    if ((aVar1 == ARES_RCODE_NOERROR) || (aVar1 == ARES_RCODE_NXDOMAIN)) {
      ares_timeval_diff((ares_timeval_t *)&rcode,&query->ts,(ares_timeval_t *)&tvdiff.usec);
      i = rcode * 1000 + (uint)tvdiff.sec / 1000;
      if (i == ARES_METRIC_1MINUTE) {
        i = ARES_METRIC_15MINUTES;
      }
      for (ts._4_4_ = ARES_METRIC_1MINUTE; ts._4_4_ < ARES_METRIC_COUNT;
          ts._4_4_ = ts._4_4_ + ARES_METRIC_15MINUTES) {
        tVar2 = ares_metric_timestamp(ts._4_4_,(ares_timeval_t *)&tvdiff.usec,ARES_FALSE);
        if (tVar2 != server->metrics[ts._4_4_].ts) {
          server->metrics[ts._4_4_].prev_ts = server->metrics[ts._4_4_].ts;
          server->metrics[ts._4_4_].prev_total_ms = server->metrics[ts._4_4_].total_ms;
          server->metrics[ts._4_4_].prev_total_count = server->metrics[ts._4_4_].total_count;
          server->metrics[ts._4_4_].ts = tVar2;
          server->metrics[ts._4_4_].latency_min_ms = 0;
          server->metrics[ts._4_4_].latency_max_ms = 0;
          server->metrics[ts._4_4_].total_ms = 0;
          server->metrics[ts._4_4_].total_count = 0;
        }
        if ((server->metrics[ts._4_4_].latency_min_ms == 0) ||
           (i < server->metrics[ts._4_4_].latency_min_ms)) {
          server->metrics[ts._4_4_].latency_min_ms = i;
        }
        if (server->metrics[ts._4_4_].latency_max_ms < i) {
          server->metrics[ts._4_4_].latency_max_ms = i;
        }
        server->metrics[ts._4_4_].total_count = server->metrics[ts._4_4_].total_count + 1;
        server->metrics[ts._4_4_].total_ms = (ulong)i + server->metrics[ts._4_4_].total_ms;
      }
    }
  }
  return;
}

Assistant:

void ares_metrics_record(const ares_query_t *query, ares_server_t *server,
                         ares_status_t status, const ares_dns_record_t *dnsrec)
{
  ares_timeval_t       now;
  ares_timeval_t       tvdiff;
  unsigned int         query_ms;
  ares_dns_rcode_t     rcode;
  ares_server_bucket_t i;

  if (status != ARES_SUCCESS) {
    return;
  }

  if (server == NULL) {
    return;
  }

  ares_tvnow(&now);

  rcode = ares_dns_record_get_rcode(dnsrec);
  if (rcode != ARES_RCODE_NOERROR && rcode != ARES_RCODE_NXDOMAIN) {
    return;
  }

  ares_timeval_diff(&tvdiff, &query->ts, &now);
  query_ms = (unsigned int)((tvdiff.sec * 1000) + (tvdiff.usec / 1000));
  if (query_ms == 0) {
    query_ms = 1;
  }

  /* Place in each bucket */
  for (i = 0; i < ARES_METRIC_COUNT; i++) {
    time_t ts = ares_metric_timestamp(i, &now, ARES_FALSE);

    /* Copy metrics to prev and clear */
    if (ts != server->metrics[i].ts) {
      server->metrics[i].prev_ts          = server->metrics[i].ts;
      server->metrics[i].prev_total_ms    = server->metrics[i].total_ms;
      server->metrics[i].prev_total_count = server->metrics[i].total_count;
      server->metrics[i].ts               = ts;
      server->metrics[i].latency_min_ms   = 0;
      server->metrics[i].latency_max_ms   = 0;
      server->metrics[i].total_ms         = 0;
      server->metrics[i].total_count      = 0;
    }

    if (server->metrics[i].latency_min_ms == 0 ||
        server->metrics[i].latency_min_ms > query_ms) {
      server->metrics[i].latency_min_ms = query_ms;
    }

    if (query_ms > server->metrics[i].latency_max_ms) {
      server->metrics[i].latency_max_ms = query_ms;
    }

    server->metrics[i].total_count++;
    server->metrics[i].total_ms += (ares_uint64_t)query_ms;
  }
}